

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPI.cxx
# Opt level: O3

Value * __thiscall
cmFileAPI::BuildCMakeFiles(Value *__return_storage_ptr__,cmFileAPI *this,Object *object)

{
  Value *pVVar1;
  Value *this_00;
  Value VStack_b8;
  Value local_90;
  Value local_68;
  Value local_40;
  
  cmFileAPICMakeFilesDump(__return_storage_ptr__,this,object->Version);
  Json::Value::Value(&local_40,ObjectKindName::objectKindNames[(int)object->Kind]);
  pVVar1 = Json::Value::operator[](__return_storage_ptr__,"kind");
  Json::Value::operator=(pVVar1,&local_40);
  Json::Value::~Value(&local_40);
  Json::Value::Value(&local_68,objectValue);
  pVVar1 = Json::Value::operator[](__return_storage_ptr__,"version");
  pVVar1 = Json::Value::operator=(pVVar1,&local_68);
  Json::Value::~Value(&local_68);
  if (object->Version == 1) {
    Json::Value::Value(&local_90,1);
    this_00 = Json::Value::operator[](pVVar1,"major");
    Json::Value::operator=(this_00,&local_90);
    Json::Value::~Value(&local_90);
    Json::Value::Value(&VStack_b8,0);
    pVVar1 = Json::Value::operator[](pVVar1,"minor");
    Json::Value::operator=(pVVar1,&VStack_b8);
    Json::Value::~Value(&VStack_b8);
  }
  return __return_storage_ptr__;
}

Assistant:

Json::Value cmFileAPI::BuildCMakeFiles(Object const& object)
{
  using namespace std::placeholders;
  Json::Value cmakeFiles = cmFileAPICMakeFilesDump(*this, object.Version);
  cmakeFiles["kind"] = this->ObjectKindName(object.Kind);

  Json::Value& version = cmakeFiles["version"] = Json::objectValue;
  if (object.Version == 1) {
    version["major"] = 1;
    version["minor"] = CMakeFilesV1Minor;
  } else {
    return cmakeFiles; // should be unreachable
  }

  return cmakeFiles;
}